

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  bool bVar1;
  int iVar2;
  char **ppcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  Slice SVar5;
  uint32_t key_length;
  Iterator iter;
  Status local_78;
  Slice local_70;
  Slice local_60;
  uint local_4c;
  Iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.data_ = key->start_;
  local_48.list_ = &this->table_;
  local_48.node_ = (Node *)0x0;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            (&local_48,&local_60.data_);
  if (local_48.node_ != (Node *)0x0) {
    ppcVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::key(&local_48);
    pcVar4 = GetVarint32Ptr(*ppcVar3,*ppcVar3 + 5,&local_4c);
    local_60.size_ = (size_t)(local_4c - 8);
    local_70.data_ = key->kstart_;
    local_70.size_ = (size_t)(key->end_ + (-8 - (long)local_70.data_));
    local_60.data_ = pcVar4;
    iVar2 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
    if (iVar2 == 0) {
      if (pcVar4[(ulong)local_4c - 8] == '\0') {
        local_60.data_ = "";
        local_60.size_ = 0;
        local_70.data_ = "";
        local_70.size_ = 0;
        Status::NotFound(&local_78,&local_60,&local_70);
        pcVar4 = s->state_;
        s->state_ = (char *)local_78;
        local_78.state_ = pcVar4;
        Status::~Status(&local_78);
      }
      else {
        if (pcVar4[(ulong)local_4c - 8] != '\x01') goto LAB_00538d62;
        SVar5 = GetLengthPrefixedSlice(pcVar4 + local_4c);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (value,SVar5.data_,SVar5.size_);
      }
      bVar1 = true;
      goto LAB_00538d64;
    }
  }
LAB_00538d62:
  bVar1 = false;
LAB_00538d64:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool MemTable::Get(const LookupKey& key, std::string* value, Status* s) {
  Slice memkey = key.memtable_key();
  Table::Iterator iter(&table_);
  iter.Seek(memkey.data());
  if (iter.Valid()) {
    // entry format is:
    //    klength  varint32
    //    userkey  char[klength]
    //    tag      uint64
    //    vlength  varint32
    //    value    char[vlength]
    // Check that it belongs to same user key.  We do not check the
    // sequence number since the Seek() call above should have skipped
    // all entries with overly large sequence numbers.
    const char* entry = iter.key();
    uint32_t key_length;
    const char* key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
    if (comparator_.comparator.user_comparator()->Compare(
            Slice(key_ptr, key_length - 8), key.user_key()) == 0) {
      // Correct user key
      const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
      switch (static_cast<ValueType>(tag & 0xff)) {
        case kTypeValue: {
          Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
          value->assign(v.data(), v.size());
          return true;
        }
        case kTypeDeletion:
          *s = Status::NotFound(Slice());
          return true;
      }
    }
  }
  return false;
}